

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseField(WastParser *this,Field *field)

{
  bool bVar1;
  Result RVar2;
  anon_class_16_2_f7c7e1e7 parse_mut_valuetype;
  anon_class_16_2_f7c7e1e7 local_28;
  Field *local_18;
  
  local_28.field = &local_18;
  local_28.this = this;
  local_18 = field;
  bVar1 = MatchLpar(this,Field);
  if (bVar1) {
    ParseBindVarOpt(this,&local_18->name);
    RVar2 = ParseField::anon_class_16_2_f7c7e1e7::operator()(&local_28);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    RVar2 = Expect(this,Rpar);
  }
  else {
    RVar2 = ParseField::anon_class_16_2_f7c7e1e7::operator()(&local_28);
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result WastParser::ParseField(Field* field) {
  WABT_TRACE(ParseField);
  auto parse_mut_valuetype = [&]() -> Result {
    // TODO: Share with ParseGlobalType?
    if (MatchLpar(TokenType::Mut)) {
      field->mutable_ = true;
      Var type;
      CHECK_RESULT(ParseValueType(&type));
      field->type = Type(type.index());
      EXPECT(Rpar);
    } else {
      field->mutable_ = false;
      Var type;
      CHECK_RESULT(ParseValueType(&type));
      field->type = Type(type.index());
    }
    return Result::Ok;
  };

  if (MatchLpar(TokenType::Field)) {
    ParseBindVarOpt(&field->name);
    CHECK_RESULT(parse_mut_valuetype());
    EXPECT(Rpar);
  } else {
    CHECK_RESULT(parse_mut_valuetype());
  }

  return Result::Ok;
}